

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O1

void * v2i_idp(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  char *__s1;
  char *value;
  int iVar1;
  ASN1_VALUE *val;
  size_t sVar2;
  CONF_VALUE *cnf;
  size_t sVar3;
  int iVar4;
  ASN1_VALUE *asn1_bool;
  
  val = ASN1_item_new((ASN1_ITEM *)&ISSUING_DIST_POINT_it);
  if (val != (ASN1_VALUE *)0x0) {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar2 == 0) {
      return val;
    }
    sVar2 = 0;
    do {
      cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,sVar2);
      __s1 = cnf->name;
      value = cnf->value;
      iVar1 = set_dist_point_name((DIST_POINT_NAME **)val,ctx,(CONF_VALUE *)cnf);
      iVar4 = 5;
      if ((iVar1 < 1) && (iVar4 = 2, -1 < iVar1)) {
        iVar1 = strcmp(__s1,"onlyuser");
        asn1_bool = val + 8;
        if ((iVar1 == 0) ||
           (((iVar1 = strcmp(__s1,"onlyCA"), asn1_bool = val + 0xc, iVar1 == 0 ||
             (iVar1 = strcmp(__s1,"onlyAA"), asn1_bool = val + 0x1c, iVar1 == 0)) ||
            (iVar1 = strcmp(__s1,"indirectCRL"), asn1_bool = val + 0x18, iVar1 == 0)))) {
          iVar1 = X509V3_get_value_bool(cnf,(int *)asn1_bool);
        }
        else {
          iVar1 = strcmp(__s1,"onlysomereasons");
          if (iVar1 != 0) {
            ERR_put_error(0x14,0,0x7b,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                          ,0x1ba);
            ERR_add_error_data(6,"section:",cnf->section,",name:",cnf->name,",value:",cnf->value);
            goto LAB_003248ee;
          }
          iVar1 = set_reasons((ASN1_BIT_STRING **)(val + 0x10),value);
        }
        if (iVar1 != 0) {
          iVar4 = 0;
        }
      }
LAB_003248ee:
      if ((iVar4 != 5) && (iVar4 != 0)) goto LAB_00324a34;
      sVar2 = sVar2 + 1;
      sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    } while (sVar2 < sVar3);
    iVar4 = 3;
LAB_00324a34:
    if (iVar4 != 2) {
      return val;
    }
  }
  ASN1_item_free(val,(ASN1_ITEM *)&ISSUING_DIST_POINT_it);
  return (void *)0x0;
}

Assistant:

static void *v2i_idp(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                     const STACK_OF(CONF_VALUE) *nval) {
  ISSUING_DIST_POINT *idp = ISSUING_DIST_POINT_new();
  if (!idp) {
    goto err;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    const char *name = cnf->name;
    const char *val = cnf->value;
    int ret = set_dist_point_name(&idp->distpoint, ctx, cnf);
    if (ret > 0) {
      continue;
    }
    if (ret < 0) {
      goto err;
    }
    if (!strcmp(name, "onlyuser")) {
      if (!X509V3_get_value_bool(cnf, &idp->onlyuser)) {
        goto err;
      }
    } else if (!strcmp(name, "onlyCA")) {
      if (!X509V3_get_value_bool(cnf, &idp->onlyCA)) {
        goto err;
      }
    } else if (!strcmp(name, "onlyAA")) {
      if (!X509V3_get_value_bool(cnf, &idp->onlyattr)) {
        goto err;
      }
    } else if (!strcmp(name, "indirectCRL")) {
      if (!X509V3_get_value_bool(cnf, &idp->indirectCRL)) {
        goto err;
      }
    } else if (!strcmp(name, "onlysomereasons")) {
      if (!set_reasons(&idp->onlysomereasons, val)) {
        goto err;
      }
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NAME);
      X509V3_conf_err(cnf);
      goto err;
    }
  }
  return idp;

err:
  ISSUING_DIST_POINT_free(idp);
  return NULL;
}